

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_resume(lua_State *L,int nargs)

{
  GCstr *pGVar1;
  ulong uVar2;
  int in_ESI;
  long in_RDI;
  undefined4 *puVar3;
  undefined4 in_stack_ffffffffffffffb0;
  int local_3c;
  
  if ((*(long *)(in_RDI + 0x30) == 0) && (*(byte *)(in_RDI + 7) < 2)) {
    local_3c = lj_vm_resume(in_RDI,*(long *)(in_RDI + 0x18) + (long)in_ESI * -8,0,0);
  }
  else {
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
    puVar3 = *(undefined4 **)(in_RDI + 0x18);
    pGVar1 = lj_err_str((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                        (ErrMsg)((ulong)puVar3 >> 0x20));
    *puVar3 = (int)pGVar1;
    puVar3[1] = 0xfffffffb;
    uVar2 = *(long *)(in_RDI + 0x18) + 8;
    *(ulong *)(in_RDI + 0x18) = uVar2;
    if (*(uint *)(in_RDI + 0x20) <= uVar2) {
      lj_state_growstack1((lua_State *)0x1197bc);
    }
    local_3c = 2;
  }
  return local_3c;
}

Assistant:

LUA_API int lua_resume(lua_State *L, int nargs)
{
  if (L->cframe == NULL && L->status <= LUA_YIELD)
    return lj_vm_resume(L, L->top - nargs, 0, 0);
  L->top = L->base;
  setstrV(L, L->top, lj_err_str(L, LJ_ERR_COSUSP));
  incr_top(L);
  return LUA_ERRRUN;
}